

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_dr_flac__seek_flac_frame(ma_dr_flac *pFlac)

{
  undefined8 uVar1;
  uint uVar2;
  ma_bool32 mVar3;
  long in_RDI;
  ulong uVar4;
  ma_uint16 actualCRC16;
  ma_uint16 desiredCRC16;
  int i;
  int channelCount;
  ma_uint8 lookup [11];
  ma_uint16 *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3c;
  short sVar5;
  short in_stack_ffffffffffffff3e;
  int iVar6;
  undefined4 in_stack_ffffffffffffff50;
  ma_result mVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined2 uVar10;
  undefined1 uVar11;
  char cVar12;
  ushort local_76;
  ushort local_62;
  
  cVar12 = *(char *)(in_RDI + 0x5a);
  uVar8 = 0x4030201;
  uVar9 = 0x8070605;
  uVar10 = 0x202;
  uVar11 = 2;
  uVar2 = (uint)(byte)(&stack0xffffffffffffff54)[cVar12];
  iVar6 = 0;
  do {
    if ((int)uVar2 <= iVar6) {
      mVar3 = ma_dr_flac__seek_bits
                        ((ma_dr_flac_bs *)
                         CONCAT26(in_stack_ffffffffffffff3e,
                                  CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)),
                         (size_t)in_stack_ffffffffffffff30);
      if (mVar3 == 0) {
        mVar7 = MA_ERROR;
      }
      else {
        if (*(int *)(in_RDI + 0x15c) == 0x40) {
          if (*(int *)(in_RDI + 0x1178) == 0) {
            uVar1 = *(undefined8 *)(in_RDI + 0x1170);
            *(ma_uint16 *)(in_RDI + 0x1168) =
                 ma_dr_flac__crc16_table
                 [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                            [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                       [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))] <<
                                                  8 ^ ma_dr_flac__crc16_table
                                                      [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                  (in_RDI + 0x1168)
                                                                                 << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(in_RDI + 0x1168) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (in_RDI + 0x1168) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                      [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (in_RDI + 0x1168) >> 8
                                                                ^ (uint)(byte)((ulong)uVar1 >> 0x38)
                                                                )] << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (in_RDI + 
                                                  0x1168) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(in_RDI + 0x1168) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (in_RDI + 0x1168) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                 (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                       (uint)(byte)((ulong)uVar1 >> 8))] << 8 ^
                 ma_dr_flac__crc16_table
                 [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                            [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                       [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (in_RDI + 0x1168) >> 8
                                                                ^ (uint)(byte)((ulong)uVar1 >> 0x38)
                                                                )] << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (in_RDI + 
                                                  0x1168) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(in_RDI + 0x1168) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (in_RDI + 0x1168) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))] << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                      [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(in_RDI + 0x1168) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (in_RDI + 0x1168) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (in_RDI + 
                                                  0x1168) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (in_RDI + 0x1168) >> 8
                                                                ^ (uint)(byte)((ulong)uVar1 >> 0x38)
                                                                )] << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (in_RDI + 
                                                  0x1168) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(in_RDI + 0x1168) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (in_RDI + 0x1168) >> 8 ^
                                                               (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar1 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar1 >> 0x10))]) >> 8 ^
                                                 (uint)(byte)((ulong)uVar1 >> 8))]) >> 8 ^
                       (uint)(byte)uVar1)];
          }
          else {
            local_76 = *(ushort *)(in_RDI + 0x1168);
            uVar1 = *(undefined8 *)(in_RDI + 0x1170);
            in_stack_ffffffffffffff30 = (ma_uint16 *)(ulong)(7 - *(int *)(in_RDI + 0x1178));
            switch(in_stack_ffffffffffffff30) {
            case (ma_uint16 *)0x7:
              local_76 = local_76 << 8 ^
                         ma_dr_flac__crc16_table
                         [(int)((int)(uint)local_76 >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x38))];
            case (ma_uint16 *)0x6:
              local_76 = local_76 << 8 ^
                         ma_dr_flac__crc16_table
                         [(int)((int)(uint)local_76 >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x30))];
            case (ma_uint16 *)0x5:
              local_76 = local_76 << 8 ^
                         ma_dr_flac__crc16_table
                         [(int)((int)(uint)local_76 >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x28))];
            case (ma_uint16 *)0x4:
              local_76 = local_76 << 8 ^
                         ma_dr_flac__crc16_table
                         [(int)((int)(uint)local_76 >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x20))];
            case (ma_uint16 *)0x3:
              local_76 = local_76 << 8 ^
                         ma_dr_flac__crc16_table
                         [(int)((int)(uint)local_76 >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x18))];
            case (ma_uint16 *)0x2:
              local_76 = local_76 << 8 ^
                         ma_dr_flac__crc16_table
                         [(int)((int)(uint)local_76 >> 8 ^ (uint)(byte)((ulong)uVar1 >> 0x10))];
            case (ma_uint16 *)0x1:
              local_76 = local_76 << 8 ^
                         ma_dr_flac__crc16_table
                         [(int)((int)(uint)local_76 >> 8 ^ (uint)(byte)((ulong)uVar1 >> 8))];
            case (ma_uint16 *)0x0:
              local_76 = local_76 << 8 ^
                         ma_dr_flac__crc16_table
                         [(int)((int)(uint)local_76 >> 8 ^ (uint)(byte)uVar1)];
            default:
              *(ushort *)(in_RDI + 0x1168) = local_76;
              *(undefined4 *)(in_RDI + 0x1178) = 0;
            }
          }
        }
        else {
          local_62 = *(ushort *)(in_RDI + 0x1168);
          uVar4 = *(ulong *)(in_RDI + 0x1170) >> (-(char)*(uint *)(in_RDI + 0x15c) & 0x3fU);
          switch((*(uint *)(in_RDI + 0x15c) >> 3) - *(int *)(in_RDI + 0x1178)) {
          case 8:
            local_62 = local_62 << 8 ^
                       ma_dr_flac__crc16_table
                       [(int)((int)(uint)local_62 >> 8 ^ (uint)(byte)(uVar4 >> 0x38))];
          case 7:
            local_62 = local_62 << 8 ^
                       ma_dr_flac__crc16_table
                       [(int)((int)(uint)local_62 >> 8 ^ (uint)(byte)(uVar4 >> 0x30))];
          case 6:
            local_62 = local_62 << 8 ^
                       ma_dr_flac__crc16_table
                       [(int)((int)(uint)local_62 >> 8 ^ (uint)(byte)(uVar4 >> 0x28))];
          case 5:
            local_62 = local_62 << 8 ^
                       ma_dr_flac__crc16_table
                       [(int)((int)(uint)local_62 >> 8 ^ (uint)(byte)(uVar4 >> 0x20))];
          case 4:
            local_62 = local_62 << 8 ^
                       ma_dr_flac__crc16_table
                       [(int)((int)(uint)local_62 >> 8 ^ (uint)(byte)(uVar4 >> 0x18))];
          case 3:
            local_62 = local_62 << 8 ^
                       ma_dr_flac__crc16_table
                       [(int)((int)(uint)local_62 >> 8 ^ (uint)(byte)(uVar4 >> 0x10))];
          case 2:
            local_62 = local_62 << 8 ^
                       ma_dr_flac__crc16_table
                       [(int)((int)(uint)local_62 >> 8 ^ (uint)(byte)(uVar4 >> 8))];
          case 1:
            local_62 = local_62 << 8 ^
                       ma_dr_flac__crc16_table[(int)((int)(uint)local_62 >> 8 ^ (uint)(byte)uVar4)];
          default:
            *(ushort *)(in_RDI + 0x1168) = local_62;
            *(uint *)(in_RDI + 0x1178) = *(uint *)(in_RDI + 0x15c) >> 3;
          }
        }
        sVar5 = *(short *)(in_RDI + 0x1168);
        mVar3 = ma_dr_flac__read_uint16
                          ((ma_dr_flac_bs *)CONCAT44(uVar2,iVar6),
                           CONCAT22(in_stack_ffffffffffffff3e,sVar5),in_stack_ffffffffffffff30);
        if (mVar3 == 0) {
          mVar7 = MA_AT_END;
        }
        else if (sVar5 == in_stack_ffffffffffffff3e) {
          mVar7 = MA_SUCCESS;
        }
        else {
          mVar7 = MA_CRC_MISMATCH;
        }
      }
      return mVar7;
    }
    mVar3 = ma_dr_flac__seek_subframe
                      ((ma_dr_flac_bs *)CONCAT17(cVar12,CONCAT16(uVar11,CONCAT24(uVar10,uVar9))),
                       (ma_dr_flac_frame *)CONCAT44(uVar8,in_stack_ffffffffffffff50),
                       (int)((ulong)in_RDI >> 0x20));
    if (mVar3 == 0) {
      return MA_ERROR;
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

static ma_result ma_dr_flac__seek_flac_frame(ma_dr_flac* pFlac)
{
    int channelCount;
    int i;
    ma_uint16 desiredCRC16;
#ifndef MA_DR_FLAC_NO_CRC
    ma_uint16 actualCRC16;
#endif
    channelCount = ma_dr_flac__get_channel_count_from_channel_assignment(pFlac->currentFLACFrame.header.channelAssignment);
    for (i = 0; i < channelCount; ++i) {
        if (!ma_dr_flac__seek_subframe(&pFlac->bs, &pFlac->currentFLACFrame, i)) {
            return MA_ERROR;
        }
    }
    if (!ma_dr_flac__seek_bits(&pFlac->bs, MA_DR_FLAC_CACHE_L1_BITS_REMAINING(&pFlac->bs) & 7)) {
        return MA_ERROR;
    }
#ifndef MA_DR_FLAC_NO_CRC
    actualCRC16 = ma_dr_flac__flush_crc16(&pFlac->bs);
#endif
    if (!ma_dr_flac__read_uint16(&pFlac->bs, 16, &desiredCRC16)) {
        return MA_AT_END;
    }
#ifndef MA_DR_FLAC_NO_CRC
    if (actualCRC16 != desiredCRC16) {
        return MA_CRC_MISMATCH;
    }
#endif
    return MA_SUCCESS;
}